

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

int PKCS12_handle_safe_bag(CBS *safe_bag,pkcs12_context *ctx)

{
  int iVar1;
  int iVar2;
  X509 *x;
  EVP_PKEY *pkey;
  size_t sVar3;
  uint8_t *friendly_name;
  CBS cert;
  CBS wrapped_value;
  size_t friendly_name_len;
  uint8_t *inp;
  CBS cert_bag;
  CBS bag_id;
  CBS wrapped_cert;
  CBS cert_type;
  uchar *local_b0;
  CBS local_a8;
  CBS local_98;
  size_t local_88;
  uint8_t *local_80;
  CBS local_78;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  CBS local_30;
  
  iVar1 = CBS_get_asn1(safe_bag,&local_50,6);
  if ((iVar1 == 0) || (iVar1 = CBS_get_asn1(safe_bag,&local_98,0xa0000000), iVar1 == 0)) {
    iVar1 = 100;
    iVar2 = 0x148;
  }
  else {
    if (safe_bag->len == 0) {
      local_78.data = (uint8_t *)0x0;
      local_78.len = 0;
    }
    else {
      iVar1 = CBS_get_asn1(safe_bag,&local_78,0x20000011);
      if ((iVar1 == 0) || (safe_bag->len != 0)) {
        iVar1 = 100;
        iVar2 = 0x14f;
        goto LAB_00196881;
      }
    }
    iVar1 = CBS_mem_equal(&local_50,kKeyBag,0xb);
    iVar2 = CBS_mem_equal(&local_50,kPKCS8ShroudedKeyBag,0xb);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = CBS_mem_equal(&local_50,kCertBag,0xb);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = CBS_get_asn1(&local_98,&local_60,0x20000010);
      if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&local_60,&local_30,6), iVar1 == 0)) ||
          (iVar1 = CBS_get_asn1(&local_60,&local_40,0xa0000000), iVar1 == 0)) ||
         (iVar1 = CBS_get_asn1(&local_40,&local_a8,4), iVar1 == 0)) {
        iVar1 = 100;
        iVar2 = 0x177;
      }
      else {
        iVar1 = CBS_mem_equal(&local_30,kX509Certificate,10);
        if (iVar1 == 0) {
          return 1;
        }
        if ((long)local_a8.len < 0) {
          iVar1 = 100;
          iVar2 = 0x182;
        }
        else {
          local_80 = local_a8.data;
          x = d2i_X509((X509 **)0x0,&local_80,local_a8.len);
          if (x != (X509 *)0x0) {
            if (local_80 != local_a8.data + local_a8.len) {
              ERR_put_error(0x13,0,100,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                            ,0x18e);
              X509_free(x);
              return 0;
            }
            iVar1 = parse_bag_attributes(&local_78,&local_b0,&local_88);
            if (iVar1 != 0) {
              if (local_88 == 0) {
                OPENSSL_free(local_b0);
              }
              else {
                iVar1 = X509_alias_set1(x,local_b0,(int)local_88);
                OPENSSL_free(local_b0);
                if (iVar1 == 0) goto LAB_00196b5c;
              }
              sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->out_certs,x);
              if (sVar3 != 0) {
                return 1;
              }
            }
LAB_00196b5c:
            X509_free(x);
            return 0;
          }
          iVar1 = 100;
          iVar2 = 0x189;
        }
      }
    }
    else {
      if (*ctx->out_key == (EVP_PKEY *)0x0) {
        if (iVar1 == 0) {
          pkey = (EVP_PKEY *)
                 PKCS8_parse_encrypted_private_key(&local_98,ctx->password,ctx->password_len);
        }
        else {
          pkey = (EVP_PKEY *)EVP_parse_private_key(&local_98);
        }
        if (pkey == (EVP_PKEY *)0x0) {
          return 0;
        }
        if (local_98.len == 0) {
          *ctx->out_key = (EVP_PKEY *)pkey;
          return 1;
        }
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x166);
        EVP_PKEY_free(pkey);
        return 0;
      }
      iVar1 = 0x71;
      iVar2 = 0x159;
    }
  }
LAB_00196881:
  ERR_put_error(0x13,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                ,iVar2);
  return 0;
}

Assistant:

static int PKCS12_handle_safe_bag(CBS *safe_bag, struct pkcs12_context *ctx) {
  CBS bag_id, wrapped_value, bag_attrs;
  if (!CBS_get_asn1(safe_bag, &bag_id, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(safe_bag, &wrapped_value,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }
  if (CBS_len(safe_bag) == 0) {
    CBS_init(&bag_attrs, NULL, 0);
  } else if (!CBS_get_asn1(safe_bag, &bag_attrs, CBS_ASN1_SET) ||
             CBS_len(safe_bag) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }

  const int is_key_bag = CBS_mem_equal(&bag_id, kKeyBag, sizeof(kKeyBag));
  const int is_shrouded_key_bag = CBS_mem_equal(&bag_id, kPKCS8ShroudedKeyBag,
                                                sizeof(kPKCS8ShroudedKeyBag));
  if (is_key_bag || is_shrouded_key_bag) {
    // See RFC 7292, section 4.2.1 and 4.2.2.
    if (*ctx->out_key) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_MULTIPLE_PRIVATE_KEYS_IN_PKCS12);
      return 0;
    }

    EVP_PKEY *pkey =
        is_key_bag ? EVP_parse_private_key(&wrapped_value)
                   : PKCS8_parse_encrypted_private_key(
                         &wrapped_value, ctx->password, ctx->password_len);
    if (pkey == NULL) {
      return 0;
    }

    if (CBS_len(&wrapped_value) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      EVP_PKEY_free(pkey);
      return 0;
    }

    *ctx->out_key = pkey;
    return 1;
  }

  if (CBS_mem_equal(&bag_id, kCertBag, sizeof(kCertBag))) {
    // See RFC 7292, section 4.2.3.
    CBS cert_bag, cert_type, wrapped_cert, cert;
    if (!CBS_get_asn1(&wrapped_value, &cert_bag, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&cert_bag, &cert_type, CBS_ASN1_OBJECT) ||
        !CBS_get_asn1(&cert_bag, &wrapped_cert,
                      CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
        !CBS_get_asn1(&wrapped_cert, &cert, CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    // Skip unknown certificate types.
    if (!CBS_mem_equal(&cert_type, kX509Certificate,
                       sizeof(kX509Certificate))) {
      return 1;
    }

    if (CBS_len(&cert) > LONG_MAX) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    const uint8_t *inp = CBS_data(&cert);
    X509 *x509 = d2i_X509(NULL, &inp, (long)CBS_len(&cert));
    if (!x509) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    if (inp != CBS_data(&cert) + CBS_len(&cert)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      X509_free(x509);
      return 0;
    }

    uint8_t *friendly_name;
    size_t friendly_name_len;
    if (!parse_bag_attributes(&bag_attrs, &friendly_name, &friendly_name_len)) {
      X509_free(x509);
      return 0;
    }
    int ok = friendly_name_len == 0 ||
             X509_alias_set1(x509, friendly_name, friendly_name_len);
    OPENSSL_free(friendly_name);
    if (!ok || 0 == sk_X509_push(ctx->out_certs, x509)) {
      X509_free(x509);
      return 0;
    }

    return 1;
  }

  // Unknown element type - ignore it.
  return 1;
}